

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

tommy_uint32_t hash_pfx_record(pfx_record *record)

{
  tommy_uint32_t tVar1;
  long in_FS_OFFSET;
  pfx_record *record_local;
  pfx_record_packed packed_record;
  
  packed_record._14_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  memset((void *)((long)&record_local + 2),0,0x16);
  if ((record->prefix).ver == LRTR_IPV4) {
    stack0xffffffffffffffda = CONCAT44(stack0xffffffffffffffde,(record->prefix).u.addr6.addr[0]);
  }
  else {
    unique0x00012000 = *(undefined8 *)&(record->prefix).u;
    packed_record.ip._0_8_ = *(undefined8 *)((long)&(record->prefix).u + 8);
  }
  packed_record.ip._8_4_ = record->asn;
  packed_record.ip[0xc] = record->min_len;
  packed_record.ip[0xd] = record->max_len;
  tVar1 = tommy_hash_u32(0,(void *)((long)&record_local + 2),0x16);
  if (*(long *)(in_FS_OFFSET + 0x28) == packed_record._14_8_) {
    return tVar1;
  }
  __stack_chk_fail();
}

Assistant:

static tommy_uint32_t hash_pfx_record(const struct pfx_record *record)
{
	struct pfx_record_packed {
		uint8_t ip[16];
		uint32_t asn;
		uint8_t min_len;
		uint8_t max_len;
	} __attribute__((packed));

	struct pfx_record_packed packed_record;

	memset(&packed_record, 0, sizeof(packed_record));

	if (record->prefix.ver == LRTR_IPV4)
		memcpy(&packed_record.ip, &record->prefix.u.addr4, sizeof(struct lrtr_ipv4_addr));
	else
		memcpy(&packed_record.ip, &record->prefix.u.addr6, sizeof(struct lrtr_ipv6_addr));

	packed_record.asn = record->asn;
	packed_record.min_len = record->min_len;
	packed_record.max_len = record->max_len;

	return tommy_hash_u32(0, &packed_record, sizeof(packed_record));
}